

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void BindToLocalPort(SOCKET s,u_short port)

{
  int *piVar1;
  char *pcVar2;
  undefined1 local_24 [8];
  sockaddr_in address;
  int v;
  u_short port_local;
  SOCKET s_local;
  
  address.sin_zero._6_2_ = port;
  memset(local_24,0,0x10);
  local_24._0_2_ = 2;
  local_24[4] = '\0';
  local_24[5] = '\0';
  local_24[6] = '\0';
  local_24[7] = '\0';
  local_24._2_2_ = htons(address.sin_zero._6_2_);
  address.sin_zero._0_4_ = bind(s,(sockaddr *)local_24,0x10);
  if (address.sin_zero._0_4_ == -1) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    I_FatalError("BindToPort: %s",pcVar2);
  }
  return;
}

Assistant:

void BindToLocalPort (SOCKET s, u_short port)
{
	int v;
	sockaddr_in address;

	memset (&address, 0, sizeof(address));
	address.sin_family = AF_INET;
	address.sin_addr.s_addr = INADDR_ANY;
	address.sin_port = htons(port);
						
	v = bind (s, (sockaddr *)&address, sizeof(address));
	if (v == SOCKET_ERROR)
		I_FatalError ("BindToPort: %s", neterror ());
}